

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O3

int runtimecap(CapState *cs,Capture *close,char *s,int *rem)

{
  lua_State *L;
  Capture *pCVar1;
  int iVar2;
  Capture *pCVar3;
  int iVar4;
  Capture *pCVar5;
  uint idx;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  L = cs->L;
  iVar2 = lua_gettop(L);
  iVar4 = 0;
  pCVar3 = close;
LAB_00127cc6:
  do {
    uVar7 = (long)close - (long)pCVar3;
    pCVar5 = pCVar3;
    do {
      pCVar3 = pCVar5 + -1;
      if (pCVar5[-1].kind == '\0') {
        iVar4 = iVar4 + 1;
        goto LAB_00127cc6;
      }
      uVar7 = uVar7 + 0x10;
      pCVar1 = pCVar5 + -1;
      pCVar5 = pCVar3;
    } while (pCVar1->siz != '\0');
    bVar8 = iVar4 != 0;
    iVar4 = iVar4 + -1;
  } while (bVar8);
  idx = 0;
  if (pCVar3 < close) {
    do {
      if (pCVar5->kind == '\r') {
        idx = (uint)pCVar5->idx;
        goto LAB_00127d15;
      }
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 < close);
    idx = 0;
  }
LAB_00127d15:
  close->kind = '\0';
  close->s = s;
  cs->cap = pCVar3;
  cs->valuecached = 0;
  luaL_checkstack(L,4,"too many runtime captures");
  lua_rawgeti(cs->L,cs->ptop + 3,(ulong)cs->cap->idx);
  lua_pushvalue(L,2);
  lua_pushinteger(L,(lua_Integer)(s + (1 - (long)cs->s)));
  iVar4 = pushnestedvalues(cs,0);
  lua_callk(L,iVar4 + 2,-1,0,(lua_KFunction)0x0);
  iVar4 = 0;
  if (idx != 0) {
    if ((int)idx <= iVar2) {
      uVar6 = iVar2 + 1;
      do {
        lua_rotate(L,idx,-1);
        lua_settop(L,-2);
        uVar6 = uVar6 - 1;
      } while (idx != uVar6);
    }
    iVar4 = (iVar2 - idx) + 1;
  }
  *rem = iVar4;
  return (int)(uVar7 >> 4);
}

Assistant:

int runtimecap (CapState *cs, Capture *close, const char *s, int *rem) {
  int n, id;
  lua_State *L = cs->L;
  int otop = lua_gettop(L);
  Capture *open = findopen(close);
  assert(captype(open) == Cgroup);
  id = finddyncap(open, close);  /* get first dynamic capture argument */
  close->kind = Cclose;  /* closes the group */
  close->s = s;
  cs->cap = open; cs->valuecached = 0;  /* prepare capture state */
  luaL_checkstack(L, 4, "too many runtime captures");
  pushluaval(cs);  /* push function to be called */
  lua_pushvalue(L, SUBJIDX);  /* push original subject */
  lua_pushinteger(L, s - cs->s + 1);  /* push current position */
  n = pushnestedvalues(cs, 0);  /* push nested captures */
  lua_call(L, n + 2, LUA_MULTRET);  /* call dynamic function */
  if (id > 0) {  /* are there old dynamic captures to be removed? */
    int i;
    for (i = id; i <= otop; i++)
      lua_remove(L, id);  /* remove old dynamic captures */
    *rem = otop - id + 1;  /* total number of dynamic captures removed */
  }
  else
    *rem = 0;  /* no dynamic captures removed */
  return close - open;  /* number of captures of all kinds removed */
}